

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TType::adoptImplicitArraySizes(TType *this,bool skipNonvariablyIndexed)

{
  TArraySizes *this_00;
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  
  while( true ) {
    iVar3 = (*this->_vptr_TType[0x1f])(this);
    if (((char)iVar3 != '\0') &&
       (((*(uint *)&(this->qualifier).field_0x8 & 0xff80) == 0x2380 ||
        (((skipNonvariablyIndexed & 1U) == 0 &&
         (iVar3 = (*this->_vptr_TType[0x21])(this), (char)iVar3 == '\0')))))) {
      uVar4 = (*this->_vptr_TType[0x12])(this);
      this_00 = this->arraySizes;
      TSmallArrayVector::changeFront(&this_00->sizes,uVar4);
      this_00->implicitlySized = false;
      (*this->_vptr_TType[0x24])(this);
    }
    if (((((this->qualifier).field_0xd & 4) != 0) && (this->arraySizes != (TArraySizes *)0x0)) &&
       (bVar2 = TArraySizes::isInnerUnsized(this->arraySizes), bVar2)) {
      TArraySizes::clearInnerUnsized(this->arraySizes);
    }
    iVar3 = (*this->_vptr_TType[0x25])(this);
    if ((char)iVar3 == '\0') break;
    pTVar5 = *(pointer *)&((this->field_13).referentType)->field_0x8;
    uVar6 = (long)(((this->field_13).referentType)->qualifier).semanticName - (long)pTVar5;
    if (uVar6 == 0) {
      return;
    }
    iVar3 = (int)(uVar6 >> 5);
    uVar4 = iVar3 - 1;
    if (1 < iVar3) {
      uVar6 = (ulong)uVar4;
      lVar7 = 0;
      do {
        adoptImplicitArraySizes
                  (*(TType **)
                    ((long)&((((this->field_13).structure)->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start)->type + lVar7),false);
        lVar7 = lVar7 + 0x20;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      pTVar5 = (((this->field_13).structure)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    pTVar1 = pTVar5[(int)uVar4].type;
    iVar3 = (*this->_vptr_TType[10])(this);
    skipNonvariablyIndexed = (*(uint *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) == 6;
    this = pTVar1;
  }
  return;
}

Assistant:

void adoptImplicitArraySizes(bool skipNonvariablyIndexed)
    {
        if (isUnsizedArray() &&
            (qualifier.builtIn == EbvSampleMask ||
                !(skipNonvariablyIndexed || isArrayVariablyIndexed()))) {
            changeOuterArraySize(getImplicitArraySize());
            setImplicitlySized(true);
        }
        // For multi-dim per-view arrays, set unsized inner dimension size to 1
        if (qualifier.isPerView() && arraySizes && arraySizes->isInnerUnsized())
            arraySizes->clearInnerUnsized();
        if (isStruct() && structure->size() > 0) {
            int lastMember = (int)structure->size() - 1;
            for (int i = 0; i < lastMember; ++i)
                (*structure)[i].type->adoptImplicitArraySizes(false);
            // implement the "last member of an SSBO" policy
            (*structure)[lastMember].type->adoptImplicitArraySizes(getQualifier().storage == EvqBuffer);
        }
    }